

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CompileLanguageNode::Evaluate
          (string *__return_storage_ptr__,CompileLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  __type _Var1;
  long lVar2;
  char *__s;
  string genName;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  if ((context->Language)._M_string_length != 0) {
    (*context->LG->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_88);
    lVar2 = std::__cxx11::string::find((char *)&local_88,0x4304fb);
    if ((((lVar2 == -1) &&
         (lVar2 = std::__cxx11::string::find((char *)&local_88,0x41cdca), lVar2 == -1)) &&
        (lVar2 = std::__cxx11::string::find((char *)&local_88,0x416afe), lVar2 == -1)) &&
       ((lVar2 = std::__cxx11::string::find((char *)&local_88,0x42d38b), lVar2 == -1 &&
        (lVar2 = std::__cxx11::string::find((char *)&local_88,0x41cdd0), lVar2 == -1)))) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"$<COMPILE_LANGUAGE:...> not supported for this generator.",
                 &local_89);
      reportError(context,&local_68,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      __rhs = (parameters->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      if (__rhs == (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&context->Language);
      }
      else {
        _Var1 = std::operator==(&context->Language,__rhs);
        __s = "0";
        if (_Var1) {
          __s = "1";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_68);
      }
    }
    std::__cxx11::string::~string((string *)&local_88);
    return __return_storage_ptr__;
  }
  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_88,content);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "$<COMPILE_LANGUAGE:...> may only be used to specify include directories, compile definitions, compile options, and to evaluate components of the file(GENERATE) command."
             ,(allocator<char> *)&local_48);
  reportError(context,&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (context->Language.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<COMPILE_LANGUAGE:...> may only be used to specify include "
        "directories, compile definitions, compile options, and to evaluate "
        "components of the file(GENERATE) command.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos) {
      reportError(context, content->GetOriginalExpression(),
                  "$<COMPILE_LANGUAGE:...> not supported for this generator.");
      return std::string();
    }
    if (parameters.empty()) {
      return context->Language;
    }
    return context->Language == parameters.front() ? "1" : "0";
  }